

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

bool __thiscall camp::Property::readable(Property *this,UserObject *object)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (*(this->super_TagHolder)._vptr_TagHolder[5])();
  if ((char)iVar2 != '\0') {
    bVar1 = detail::Getter<bool>::get(&this->m_readable,object);
    return bVar1;
  }
  return false;
}

Assistant:

bool Property::readable(const UserObject& object) const
{
    return isReadable() && m_readable.get(object);
}